

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void highbd_inv_txfm2d_add_v_identity_ssse41
               (int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  int *piVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  long lVar10;
  undefined8 *puVar11;
  byte in_CL;
  long lVar12;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  int i_2;
  int i_1;
  __m128i u3_1;
  __m128i u2_1;
  __m128i u1_1;
  __m128i u0_1;
  int j_1;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  int j;
  __m128i *_buf1;
  __m128i buf0 [16];
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_sse4_1 col_txfm;
  transform_1d_sse4_1 row_txfm;
  int fun_idx;
  int rect_type;
  int buf_size_nonzero_w;
  int buf_size_nonzero_w_div8;
  int input_stride;
  int row_max;
  int buf_size_w_div4;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int eoby;
  int eobx;
  __m128i buf1 [64];
  int local_838;
  int local_834;
  int in_stack_fffffffffffff7d0;
  int iVar13;
  int in_stack_fffffffffffff7d8;
  int in_stack_fffffffffffff7dc;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  int in_stack_fffffffffffff808;
  int in_stack_fffffffffffff80c;
  int in_stack_fffffffffffff810;
  int in_stack_fffffffffffff814;
  uint16_t *in_stack_fffffffffffff818;
  undefined4 in_stack_fffffffffffff820;
  int in_stack_fffffffffffff824;
  int in_stack_fffffffffffff83c;
  int in_stack_fffffffffffff840;
  int in_stack_fffffffffffff844;
  int in_stack_fffffffffffff848;
  int in_stack_fffffffffffff84c;
  undefined4 in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff854;
  uint local_794;
  longlong local_788 [32];
  int local_684;
  int local_680;
  int local_67c;
  transform_1d_sse4_1 local_678;
  transform_1d_sse4_1 local_670;
  int local_664;
  int local_660;
  int local_65c;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  char *local_638;
  int local_630;
  int local_62c;
  undefined8 local_628;
  int aiStack_620 [256];
  byte local_21e;
  byte local_21d;
  long local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  longlong lStack_180;
  undefined8 local_178;
  longlong lStack_170;
  undefined8 local_168;
  longlong lStack_160;
  undefined8 local_158;
  longlong lStack_150;
  undefined8 local_148;
  longlong lStack_140;
  undefined8 local_138;
  longlong lStack_130;
  undefined8 local_128;
  longlong lStack_120;
  undefined8 local_118;
  longlong lStack_110;
  longlong local_108;
  undefined8 uStack_100;
  longlong local_f8;
  undefined8 uStack_f0;
  longlong local_e8;
  undefined8 uStack_e0;
  longlong local_d8;
  undefined8 uStack_d0;
  longlong local_c8;
  undefined8 uStack_c0;
  longlong local_b8;
  undefined8 uStack_b0;
  longlong local_a8;
  undefined8 uStack_a0;
  longlong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_21e = in_R8B;
  local_21d = in_CL;
  local_210 = in_RDI;
  get_eobx_eoby_scan_h_identity(&local_62c,&local_630,in_R8B,in_R9D);
  local_638 = av1_inv_txfm_shift_ls[local_21e];
  local_63c = get_txw_idx(local_21e);
  local_640 = get_txh_idx(local_21e);
  local_644 = tx_size_wide[local_21e];
  local_648 = tx_size_high[local_21e];
  local_834 = local_644;
  if (0x20 < local_644) {
    local_834 = 0x20;
  }
  local_64c = local_834 >> 2;
  local_838 = local_648;
  if (0x20 < local_648) {
    local_838 = 0x20;
  }
  local_650 = local_838;
  local_654 = local_838;
  local_658 = local_62c + 8 >> 3;
  local_65c = local_658 << 3;
  local_660 = get_rect_tx_log_ratio(local_644,local_648);
  local_664 = lowbd_txfm_all_1d_zeros_idx[local_62c];
  local_670 = highbd_txfm_all_1d_zeros_w8_arr[local_63c][""[local_21d]][local_664];
  local_678 = highbd_txfm_all_1d_zeros_w8_arr[local_640][""[local_21d]][0];
  get_flip_cfg(local_21d,&local_67c,&local_680);
  for (local_684 = 0; local_684 < local_650 >> 2; local_684 = local_684 + 1) {
    load_buffer_32bit_input
              ((int32_t *)(local_210 + (long)(local_684 << 2) * 4),local_654,(__m128i *)local_788,
               local_65c);
    if ((local_660 == 1) || (local_660 == -1)) {
      av1_round_shift_rect_array_32_sse4_1
                ((__m128i *)CONCAT44(in_stack_fffffffffffff854,in_stack_fffffffffffff850),
                 (__m128i *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                 in_stack_fffffffffffff844,in_stack_fffffffffffff840,in_stack_fffffffffffff83c);
    }
    (*local_670)((__m128i *)local_788,(__m128i *)local_788,0xc,0,i_2,-(int)*local_638);
    lVar12 = (long)(local_684 << 2);
    if (local_680 == 0) {
      for (in_stack_fffffffffffff824 = 0; in_stack_fffffffffffff824 < local_64c;
          in_stack_fffffffffffff824 = in_stack_fffffffffffff824 + 1) {
        lVar10 = (long)(in_stack_fffffffffffff824 << 2);
        local_158 = local_788[lVar10 * 2];
        local_168 = local_788[lVar10 * 2 + 2];
        lVar5 = local_158;
        lStack_150 = local_788[lVar10 * 2 + 1];
        lVar4 = local_168;
        lStack_160 = local_788[lVar10 * 2 + 3];
        local_158._4_4_ = (int)((ulong)local_158 >> 0x20);
        local_168._4_4_ = (int)((ulong)local_168 >> 0x20);
        lVar10 = (long)(in_stack_fffffffffffff824 << 2);
        uStack_d0 = local_788[lVar10 * 2 + 1];
        uStack_e0 = local_788[lVar10 * 2 + 3];
        local_d8 = local_788[lVar10 * 2];
        lVar9 = uStack_d0;
        local_e8 = local_788[lVar10 * 2 + 2];
        lVar8 = uStack_e0;
        uStack_d0._4_4_ = (undefined4)((ulong)uStack_d0 >> 0x20);
        uStack_e0._4_4_ = (undefined4)((ulong)uStack_e0 >> 0x20);
        lVar10 = (long)(in_stack_fffffffffffff824 << 2);
        local_178 = local_788[lVar10 * 2 + 4];
        local_188 = local_788[lVar10 * 2 + 6];
        lVar3 = local_178;
        lStack_170 = local_788[lVar10 * 2 + 5];
        lVar2 = local_188;
        lStack_180 = local_788[lVar10 * 2 + 7];
        local_178._4_4_ = (int)((ulong)local_178 >> 0x20);
        local_188._4_4_ = (int)((ulong)local_188 >> 0x20);
        lVar10 = (long)(in_stack_fffffffffffff824 << 2);
        uStack_f0 = local_788[lVar10 * 2 + 5];
        uStack_100 = local_788[lVar10 * 2 + 7];
        local_f8 = local_788[lVar10 * 2 + 4];
        lVar7 = uStack_f0;
        local_108 = local_788[lVar10 * 2 + 6];
        lVar6 = uStack_100;
        uStack_f0._4_4_ = (undefined4)((ulong)uStack_f0 >> 0x20);
        uStack_100._4_4_ = (undefined4)((ulong)uStack_100 >> 0x20);
        local_1d8 = CONCAT44((int)local_168,(int)local_158);
        uStack_1d0 = CONCAT44(local_168._4_4_,local_158._4_4_);
        local_1e8 = CONCAT44((int)local_188,(int)local_178);
        uStack_1e0 = CONCAT44(local_188._4_4_,local_178._4_4_);
        piVar1 = (int *)(&local_628 + lVar12 * 2 + (long)(in_stack_fffffffffffff824 * local_648) * 2
                        );
        *piVar1 = (int)local_158;
        piVar1[1] = (int)local_168;
        piVar1[2] = (int)local_178;
        piVar1[3] = (int)local_188;
        local_58 = CONCAT44((int)local_168,(int)local_158);
        uStack_50 = CONCAT44(local_168._4_4_,local_158._4_4_);
        local_68 = CONCAT44((int)local_188,(int)local_178);
        uStack_60 = CONCAT44(local_188._4_4_,local_178._4_4_);
        piVar1 = aiStack_620 + lVar12 * 4 + (long)(in_stack_fffffffffffff824 * local_648) * 4 + 2;
        *piVar1 = local_158._4_4_;
        piVar1[1] = local_168._4_4_;
        piVar1[2] = local_178._4_4_;
        piVar1[3] = local_188._4_4_;
        local_1f8 = CONCAT44((int)uStack_e0,(int)uStack_d0);
        uStack_1f0 = CONCAT44(uStack_e0._4_4_,uStack_d0._4_4_);
        local_208 = CONCAT44((int)uStack_100,(int)uStack_f0);
        uStack_200 = CONCAT44(uStack_100._4_4_,uStack_f0._4_4_);
        piVar1 = aiStack_620 + lVar12 * 4 + (long)(in_stack_fffffffffffff824 * local_648) * 4 + 6;
        *piVar1 = (int)uStack_d0;
        piVar1[1] = (int)uStack_e0;
        piVar1[2] = (int)uStack_f0;
        piVar1[3] = (int)uStack_100;
        local_78 = CONCAT44((int)uStack_e0,(int)uStack_d0);
        uStack_70 = CONCAT44(uStack_e0._4_4_,uStack_d0._4_4_);
        local_88 = CONCAT44((int)uStack_100,(int)uStack_f0);
        uStack_80 = CONCAT44(uStack_100._4_4_,uStack_f0._4_4_);
        puVar11 = &local_628 + lVar12 * 2 + (long)(in_stack_fffffffffffff824 * local_648 + 3) * 2;
        *(undefined4 *)puVar11 = uStack_d0._4_4_;
        *(undefined4 *)((long)puVar11 + 4) = uStack_e0._4_4_;
        *(undefined4 *)(puVar11 + 1) = uStack_f0._4_4_;
        *(undefined4 *)((long)puVar11 + 0xc) = uStack_100._4_4_;
        in_stack_fffffffffffff7d8 = (int)uStack_f0;
        in_stack_fffffffffffff7dc = (int)uStack_100;
        in_stack_fffffffffffff7e0 = uStack_f0._4_4_;
        in_stack_fffffffffffff7e4 = uStack_100._4_4_;
        in_stack_fffffffffffff808 = (int)local_158;
        in_stack_fffffffffffff80c = (int)local_168;
        in_stack_fffffffffffff810 = local_158._4_4_;
        in_stack_fffffffffffff814 = local_168._4_4_;
        local_188 = lVar2;
        local_178 = lVar3;
        local_168 = lVar4;
        local_158 = lVar5;
        uStack_100 = lVar6;
        uStack_f0 = lVar7;
        uStack_e0 = lVar8;
        uStack_d0 = lVar9;
      }
    }
    else {
      for (local_794 = 0; (int)local_794 < local_64c; local_794 = local_794 + 1) {
        lVar10 = (long)(int)(local_794 << 2);
        local_128 = local_788[lVar10 * 2 + 4];
        local_118 = local_788[lVar10 * 2 + 6];
        lVar5 = local_118;
        lStack_110 = local_788[lVar10 * 2 + 7];
        lVar4 = local_128;
        lStack_120 = local_788[lVar10 * 2 + 5];
        local_118._4_4_ = (int)((ulong)local_118 >> 0x20);
        local_128._4_4_ = (int)((ulong)local_128 >> 0x20);
        lVar10 = (long)(int)(local_794 << 2);
        uStack_a0 = local_788[lVar10 * 2 + 5];
        uStack_90 = local_788[lVar10 * 2 + 7];
        local_98 = local_788[lVar10 * 2 + 6];
        lVar9 = uStack_90;
        local_a8 = local_788[lVar10 * 2 + 4];
        lVar8 = uStack_a0;
        uStack_90._4_4_ = (undefined4)((ulong)uStack_90 >> 0x20);
        uStack_a0._4_4_ = (undefined4)((ulong)uStack_a0 >> 0x20);
        lVar10 = (long)(int)(local_794 << 2);
        local_148 = local_788[lVar10 * 2];
        local_138 = local_788[lVar10 * 2 + 2];
        lVar3 = local_138;
        lStack_130 = local_788[lVar10 * 2 + 3];
        lVar2 = local_148;
        lStack_140 = local_788[lVar10 * 2 + 1];
        local_138._4_4_ = (int)((ulong)local_138 >> 0x20);
        local_148._4_4_ = (int)((ulong)local_148 >> 0x20);
        lVar10 = (long)(int)(local_794 << 2);
        uStack_c0 = local_788[lVar10 * 2 + 1];
        uStack_b0 = local_788[lVar10 * 2 + 3];
        local_b8 = local_788[lVar10 * 2 + 2];
        lVar7 = uStack_b0;
        local_c8 = local_788[lVar10 * 2];
        lVar6 = uStack_c0;
        uStack_b0._4_4_ = (undefined4)((ulong)uStack_b0 >> 0x20);
        uStack_c0._4_4_ = (undefined4)((ulong)uStack_c0 >> 0x20);
        local_198 = CONCAT44((undefined4)local_128,(undefined4)local_118);
        uStack_190 = CONCAT44(local_128._4_4_,local_118._4_4_);
        local_1a8 = CONCAT44((int)local_148,(undefined4)local_138);
        uStack_1a0 = CONCAT44(local_148._4_4_,local_138._4_4_);
        puVar11 = &local_628 + lVar12 * 2 + (long)(int)(local_648 * (~local_794 + local_64c)) * 2;
        *(undefined4 *)puVar11 = (undefined4)local_118;
        *(undefined4 *)((long)puVar11 + 4) = (undefined4)local_128;
        *(undefined4 *)(puVar11 + 1) = (undefined4)local_138;
        *(int *)((long)puVar11 + 0xc) = (int)local_148;
        local_18 = CONCAT44((undefined4)local_128,(undefined4)local_118);
        uStack_10 = CONCAT44(local_128._4_4_,local_118._4_4_);
        local_28 = CONCAT44((int)local_148,(undefined4)local_138);
        uStack_20 = CONCAT44(local_148._4_4_,local_138._4_4_);
        piVar1 = aiStack_620 +
                 lVar12 * 4 + (long)(int)(local_648 * (~local_794 + local_64c)) * 4 + 2;
        *piVar1 = local_118._4_4_;
        piVar1[1] = local_128._4_4_;
        piVar1[2] = local_138._4_4_;
        piVar1[3] = local_148._4_4_;
        local_1b8 = CONCAT44((int)uStack_a0,(int)uStack_90);
        uStack_1b0 = CONCAT44(uStack_a0._4_4_,uStack_90._4_4_);
        local_1c8 = CONCAT44((int)uStack_c0,(int)uStack_b0);
        uStack_1c0 = CONCAT44(uStack_c0._4_4_,uStack_b0._4_4_);
        piVar1 = aiStack_620 +
                 lVar12 * 4 + (long)(int)(local_648 * (~local_794 + local_64c)) * 4 + 6;
        *piVar1 = (int)uStack_90;
        piVar1[1] = (int)uStack_a0;
        piVar1[2] = (int)uStack_b0;
        piVar1[3] = (int)uStack_c0;
        local_38 = CONCAT44((int)uStack_a0,(int)uStack_90);
        uStack_30 = CONCAT44(uStack_a0._4_4_,uStack_90._4_4_);
        local_48 = CONCAT44((int)uStack_c0,(int)uStack_b0);
        uStack_40 = CONCAT44(uStack_c0._4_4_,uStack_b0._4_4_);
        puVar11 = &local_628 +
                  lVar12 * 2 + (long)(int)(local_648 * ((local_64c + -1) - local_794) + 3) * 2;
        *(undefined4 *)puVar11 = uStack_90._4_4_;
        *(undefined4 *)((long)puVar11 + 4) = uStack_a0._4_4_;
        *(undefined4 *)(puVar11 + 1) = uStack_b0._4_4_;
        *(undefined4 *)((long)puVar11 + 0xc) = uStack_c0._4_4_;
        in_stack_fffffffffffff83c = (int)local_148;
        in_stack_fffffffffffff840 = local_138._4_4_;
        in_stack_fffffffffffff844 = local_148._4_4_;
        in_stack_fffffffffffff848 = (int)uStack_90;
        in_stack_fffffffffffff84c = (int)uStack_a0;
        in_stack_fffffffffffff850 = uStack_90._4_4_;
        in_stack_fffffffffffff854 = uStack_a0._4_4_;
        local_148 = lVar2;
        local_138 = lVar3;
        local_128 = lVar4;
        local_118 = lVar5;
        uStack_c0 = lVar6;
        uStack_b0 = lVar7;
        uStack_a0 = lVar8;
        uStack_90 = lVar9;
      }
    }
  }
  for (iVar13 = 0; iVar13 < local_64c; iVar13 = iVar13 + 1) {
    (*local_678)((__m128i *)(&local_628 + (long)(iVar13 * local_648) * 2),
                 (__m128i *)(&local_628 + (long)(iVar13 * local_648) * 2),0xc,1,i_2,0);
    av1_round_shift_array_32_sse4_1
              ((__m128i *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
               (__m128i *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),iVar13,
               in_stack_fffffffffffff7d0);
  }
  for (iVar13 = 0; iVar13 < local_644 >> 3; iVar13 = iVar13 + 1) {
    highbd_write_buffer_8xn_sse4_1
              ((__m128i *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
               in_stack_fffffffffffff818,in_stack_fffffffffffff814,in_stack_fffffffffffff810,
               in_stack_fffffffffffff80c,in_stack_fffffffffffff808);
  }
  return;
}

Assistant:

static void highbd_inv_txfm2d_add_v_identity_ssse41(const int32_t *input,
                                                    uint16_t *output,
                                                    int stride, TX_TYPE tx_type,
                                                    TX_SIZE tx_size, int eob,
                                                    const int bd) {
  __m128i buf1[64];
  int eobx, eoby;
  get_eobx_eoby_scan_h_identity(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div4 = AOMMIN(32, txfm_size_col) >> 2;
  const int row_max = AOMMIN(32, txfm_size_row);
  const int input_stride = row_max;
  const int buf_size_nonzero_w_div8 = (eobx + 8) >> 3;
  const int buf_size_nonzero_w = buf_size_nonzero_w_div8 << 3;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);
  const int fun_idx = lowbd_txfm_all_1d_zeros_idx[eobx];
  const transform_1d_sse4_1 row_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx];
  const transform_1d_sse4_1 col_txfm =
      highbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][0];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < (row_max >> 2); ++i) {
    __m128i buf0[16];
    load_buffer_32bit_input(input + i * 4, input_stride, buf0,
                            buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      av1_round_shift_rect_array_32_sse4_1(buf0, buf0, buf_size_nonzero_w, 0,
                                           NewInvSqrt2);
    }
    row_txfm(buf0, buf0, INV_COS_BIT, 0, bd, -shift[0]);

    __m128i *_buf1 = buf1 + i * 4;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div4; ++j) {
        TRANSPOSE_4X4(buf0[4 * j + 3], buf0[4 * j + 2], buf0[4 * j + 1],
                      buf0[4 * j],
                      _buf1[txfm_size_row * (buf_size_w_div4 - 1 - j) + 0],
                      _buf1[txfm_size_row * (buf_size_w_div4 - 1 - j) + 1],
                      _buf1[txfm_size_row * (buf_size_w_div4 - 1 - j) + 2],
                      _buf1[txfm_size_row * (buf_size_w_div4 - 1 - j) + 3]);
      }
    } else {
      for (int j = 0; j < buf_size_w_div4; ++j) {
        TRANSPOSE_4X4(
            buf0[j * 4 + 0], buf0[j * 4 + 1], buf0[j * 4 + 2], buf0[j * 4 + 3],
            _buf1[j * txfm_size_row + 0], _buf1[j * txfm_size_row + 1],
            _buf1[j * txfm_size_row + 2], _buf1[j * txfm_size_row + 3]);
      }
    }
  }
  for (int i = 0; i < buf_size_w_div4; i++) {
    col_txfm(buf1 + i * txfm_size_row, buf1 + i * txfm_size_row, INV_COS_BIT, 1,
             bd, 0);

    av1_round_shift_array_32_sse4_1(buf1 + i * txfm_size_row,
                                    buf1 + i * txfm_size_row, txfm_size_row,
                                    -shift[1]);
  }

  // write to buffer
  {
    for (int i = 0; i < (txfm_size_col >> 3); i++) {
      highbd_write_buffer_8xn_sse4_1(buf1 + i * txfm_size_row * 2,
                                     output + 8 * i, stride, ud_flip,
                                     txfm_size_row, bd);
    }
  }
}